

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

Node ** __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::
childByTop(SListIntermediateNode *this,Top t,bool canCreate)

{
  Top key;
  bool bVar1;
  byte in_CL;
  bool found;
  Node **res;
  undefined7 in_stack_00000028;
  undefined4 in_stack_00000048;
  undefined8 local_38;
  
  key._inner._inner._content[3] = t._inner._inner._0_1_;
  key._inner._inner._content[4] = t._inner._inner._content[0];
  key._inner._inner._content[5] = t._inner._inner._content[1];
  key._inner._inner._content[6] = t._inner._inner._content[2];
  key._inner._inner._content[7] = t._inner._inner._content[3];
  key._inner._inner._9_1_ = t._inner._inner._content[4];
  key._inner._inner._10_1_ = t._inner._inner._content[5];
  key._inner._inner._11_1_ = t._inner._inner._content[6];
  key._inner._inner._0_4_ = in_stack_00000048;
  bVar1 = Lib::
          SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
          ::getPosition<Kernel::TermList::Top>
                    ((SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
                      *)this,key,(Node ***)CONCAT17(canCreate,in_stack_00000028),res._7_1_);
  if (!bVar1) {
    if ((in_CL & 1) == 0) {
      local_38 = (Node **)0x0;
    }
    else {
      *local_38 = (Node *)0x0;
    }
  }
  return local_38;
}

Assistant:

virtual Node** childByTop(TermList::Top t, bool canCreate)
      {
        Node** res;
        bool found=_nodes.getPosition(t,res,canCreate);
        if(!found) {
          if(canCreate) {
            *res=0;
          } else {
            res=0;
          }
        }
        return res;
      }